

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O0

void __thiscall cmCPackIFWGenerator::cmCPackIFWGenerator(cmCPackIFWGenerator *this)

{
  cmCPackIFWGenerator *this_local;
  
  cmCPackGenerator::cmCPackGenerator(&this->super_cmCPackGenerator);
  cmCPackIFWCommon::cmCPackIFWCommon(&this->super_cmCPackIFWCommon);
  (this->super_cmCPackGenerator)._vptr_cmCPackGenerator = (_func_int **)&PTR_GetNameOfClass_00cbb4f0
  ;
  cmCPackIFWInstaller::cmCPackIFWInstaller(&this->Installer);
  cmCPackIFWRepository::cmCPackIFWRepository(&this->Repository);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
  ::map(&this->Packages);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>_>_>
  ::map(&this->Repositories);
  std::
  set<cmCPackIFWPackage_*,_std::less<cmCPackIFWPackage_*>,_std::allocator<cmCPackIFWPackage_*>_>::
  set(&this->BinaryPackages);
  std::
  set<cmCPackIFWPackage_*,_std::less<cmCPackIFWPackage_*>,_std::allocator<cmCPackIFWPackage_*>_>::
  set(&this->DownloadedPackages);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>_>
  ::map(&this->DependentPackages);
  std::
  map<cmCPackComponent_*,_cmCPackIFWPackage_*,_std::less<cmCPackComponent_*>,_std::allocator<std::pair<cmCPackComponent_*const,_cmCPackIFWPackage_*>_>_>
  ::map(&this->ComponentPackages);
  std::
  map<cmCPackComponentGroup_*,_cmCPackIFWPackage_*,_std::less<cmCPackComponentGroup_*>,_std::allocator<std::pair<cmCPackComponentGroup_*const,_cmCPackIFWPackage_*>_>_>
  ::map(&this->GroupPackages);
  std::__cxx11::string::string((string *)&this->RepoGen);
  std::__cxx11::string::string((string *)&this->BinCreator);
  std::__cxx11::string::string((string *)&this->FrameworkVersion);
  std::__cxx11::string::string((string *)&this->ExecutableSuffix);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->PkgsDirsVector);
  (this->super_cmCPackIFWCommon).Generator = this;
  return;
}

Assistant:

cmCPackIFWGenerator::cmCPackIFWGenerator()
{
  this->Generator = this;
}